

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<char[11],char_const*,char[14],char_const*,char[65],char_const*,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [11],char **Args_1,
          char (*Args_2) [14],char **Args_3,char (*Args_4) [65],char **Args_5,char (*Args_6) [3])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[11],char_const*,char[14],char_const*,char[65],char_const*,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [11])this,(char **)Args,(char (*) [14])Args_1,(char **)Args_2,
             (char (*) [65])Args_3,(char **)Args_4,(char (*) [3])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}